

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * google::protobuf::compiler::ruby::DefaultValueForField_abi_cxx11_(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  char *pcVar4;
  EnumValueDescriptor *this;
  string *psVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  int i;
  string default_str;
  ostringstream os;
  FieldDescriptor *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  allocator local_1c9;
  int local_1c8;
  int local_1c4;
  string local_1c0 [32];
  long local_1a0 [29];
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  allocator local_11;
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4ca031);
  switch(CVar2) {
  case CPPTYPE_INT32:
    FieldDescriptor::default_value_int32(local_10);
    NumberToString<int>((int)in_stack_ffffffffffffff4c);
    break;
  case CPPTYPE_INT64:
    FieldDescriptor::default_value_int64(local_10);
    NumberToString<long>(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    break;
  case CPPTYPE_UINT32:
    FieldDescriptor::default_value_uint32(local_10);
    NumberToString<unsigned_int>((uint)in_stack_ffffffffffffff4c);
    break;
  case CPPTYPE_UINT64:
    FieldDescriptor::default_value_uint64(local_10);
    NumberToString<unsigned_long>(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    break;
  case CPPTYPE_DOUBLE:
    FieldDescriptor::default_value_double(local_10);
    NumberToString<double>((double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    break;
  case CPPTYPE_FLOAT:
    FieldDescriptor::default_value_float(local_10);
    NumberToString<float>(in_stack_ffffffffffffff4c);
    break;
  case CPPTYPE_BOOL:
    bVar1 = FieldDescriptor::default_value_bool(local_10);
    pcVar4 = "false";
    if (bVar1) {
      pcVar4 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar4,&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
    break;
  case CPPTYPE_ENUM:
    this = FieldDescriptor::default_value_enum(in_stack_fffffffffffffdb0);
    EnumValueDescriptor::number(this);
    NumberToString<int>((int)in_stack_ffffffffffffff4c);
    break;
  case CPPTYPE_STRING:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    psVar5 = FieldDescriptor::default_value_string_abi_cxx11_(local_10);
    std::__cxx11::string::string(local_1c0,(string *)psVar5);
    TVar3 = FieldDescriptor::type
                      ((FieldDescriptor *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (TVar3 == TYPE_STRING) {
      poVar6 = std::operator<<((ostream *)local_1a0,"\"");
      poVar6 = std::operator<<(poVar6,local_1c0);
      std::operator<<(poVar6,"\"");
    }
    else {
      TVar3 = FieldDescriptor::type
                        ((FieldDescriptor *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      if (TVar3 == TYPE_BYTES) {
        std::operator<<((ostream *)local_1a0,"\"");
        std::ios::fill((char)local_1a0 + (char)*(undefined8 *)(local_1a0[0] + -0x18));
        for (local_1c4 = 0; uVar7 = (ulong)local_1c4, uVar8 = std::__cxx11::string::length(),
            uVar7 < uVar8; local_1c4 = local_1c4 + 1) {
          poVar6 = std::operator<<((ostream *)local_1a0,"\\x");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
          local_1c8 = (int)std::setw(2);
          poVar6 = std::operator<<(poVar6,(_Setw)local_1c8);
          pbVar9 = (byte *)std::__cxx11::string::at((ulong)local_1c0);
          std::ostream::operator<<(poVar6,(ushort)*pbVar9);
        }
        std::operator<<((ostream *)local_1a0,"\".force_encoding(\"ASCII-8BIT\")");
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_1c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  return in_RDI;
}

Assistant:

std::string DefaultValueForField(const FieldDescriptor* field) {
  switch(field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return NumberToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_INT64:
      return NumberToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT32:
      return NumberToString(field->default_value_uint32());
    case FieldDescriptor::CPPTYPE_UINT64:
      return NumberToString(field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_FLOAT:
      return NumberToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return NumberToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      return NumberToString(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING: {
      std::ostringstream os;
      string default_str = field->default_value_string();

      if (field->type() == FieldDescriptor::TYPE_STRING) {
        os << "\"" << default_str << "\"";
      } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
        os << "\"";

        os.fill('0');
        for (int i = 0; i < default_str.length(); ++i) {
          // Write the hex form of each byte.
          os << "\\x" << std::hex << std::setw(2)
             << ((uint16)((unsigned char)default_str.at(i)));
        }
        os << "\".force_encoding(\"ASCII-8BIT\")";
      }

      return os.str();
    }
    default: assert(false); return "";
  }
}